

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O2

string * __thiscall cmCTest::GetCurrentTag_abi_cxx11_(string *__return_storage_ptr__,cmCTest *this)

{
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->CurrentTag);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTest::GetCurrentTag()
{
  return this->CurrentTag;
}